

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::verifyRenderResult
          (GridRenderCase *this,IterationConfig *config)

{
  IVec2 *viewportSize;
  ostringstream *poVar1;
  uint uVar2;
  size_type sVar3;
  RenderContext *context;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  TestLog *pTVar7;
  int iVar8;
  ConstPixelBufferAccess *access;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *access_00;
  LogImageSet *access_01;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar9;
  GridRenderCase *pGVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Surface viewportSurface;
  Surface errorMask;
  IVec4 viewportGridInnerArea;
  IVec4 viewportGridOuterArea;
  ProjectedBBox projectedBBox;
  Surface local_4c0;
  IVec2 *local_4a8;
  Surface local_4a0;
  GridRenderCase *local_488;
  float local_47c;
  float local_478;
  float local_474;
  float local_470;
  float local_46c;
  string local_468;
  string local_448;
  string local_428;
  undefined1 local_408 [20];
  int local_3f4;
  int local_3f0;
  int local_3ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 local_3c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined1 local_390 [40];
  string local_368;
  undefined1 local_348 [32];
  float local_328;
  float local_324;
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  LogImageSet local_310;
  LogImage local_2d0;
  LogImage local_240;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_488 = this;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_3c8._0_8_ = CONCAT44(extraout_var,iVar4);
  projectBoundingBox(&config->bbox);
  viewportSize = &config->viewportSize;
  local_474 = local_328;
  iVar4 = (config->viewportSize).m_data[0];
  iVar13 = (config->viewportSize).m_data[1];
  fVar15 = (float)iVar4;
  local_47c = local_324;
  fVar17 = (float)iVar13;
  local_4a8 = (IVec2 *)CONCAT44(local_4a8._4_4_,(local_324 * 0.5 + 0.5) * fVar17);
  local_478 = local_31c;
  fVar16 = local_318 * 0.5;
  fVar14 = floorf((local_328 * 0.5 + 0.5) * fVar15);
  local_46c = floorf(local_4a8._0_4_);
  fVar15 = ceilf((local_31c * 0.5 + 0.5) * fVar15 + 0.0);
  local_470 = ceilf((fVar16 + 0.5) * fVar17 + 0.0);
  BBoxRenderCase::getViewportPatternArea
            ((BBoxRenderCase *)(local_408 + 0x10),&config->patternPos,&config->patternSize,
             viewportSize,ROUND_OUTWARDS);
  local_4a8 = viewportSize;
  BBoxRenderCase::getViewportPatternArea
            ((BBoxRenderCase *)local_408,&config->patternPos,&config->patternSize,viewportSize,
             ROUND_INWARDS);
  tcu::Surface::Surface(&local_4c0,iVar4,iVar13);
  tcu::Surface::Surface
            (&local_4a0,(config->viewportSize).m_data[0],(config->viewportSize).m_data[1]);
  pGVar10 = local_488;
  iVar13 = (int)fVar14;
  iVar4 = (int)local_46c;
  iVar12 = (int)fVar15;
  iVar5 = (int)local_470;
  if (*(char *)((long)&local_488->m_program + 3) == '\0') {
    local_1b0._0_8_ = ((local_488->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Projected bounding box: (clip space)\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx: [",5);
    std::ostream::_M_insert<double>((double)local_474);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)local_478);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty: [",5);
    std::ostream::_M_insert<double>((double)local_47c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)local_318);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz: [",5);
    std::ostream::_M_insert<double>((double)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)local_314);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"In viewport coordinates:\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx: [",5);
    std::ostream::operator<<(poVar1,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty: [",5);
    std::ostream::operator<<(poVar1,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying render results within the bounding box.\n",0x32);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = ((local_488->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Verifying render result.",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  sVar3 = pGVar10[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length;
  if (sVar3 != 0) {
    (**(code **)(local_3c8._0_8_ + 0x78))(0x8ca8,*(undefined4 *)(sVar3 + 0x10));
  }
  context = ((pGVar10->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (config->viewportPos).m_data[0];
  iVar8 = (config->viewportPos).m_data[1];
  local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar11 = (void *)local_4c0.m_pixels.m_cap;
  if ((void *)local_4c0.m_pixels.m_cap != (void *)0x0) {
    pvVar11 = local_4c0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,local_4c0.m_width,
             local_4c0.m_height,1,pvVar11);
  glu::readPixels(context,iVar6,iVar8,(PixelBufferAccess *)local_1b0);
  local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar11 = (void *)local_4a0.m_pixels.m_cap;
  if ((void *)local_4a0.m_pixels.m_cap != (void *)0x0) {
    pvVar11 = local_4a0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,local_4a0.m_width,
             local_4a0.m_height,1,pvVar11);
  local_2d0.m_name._M_dataplus._M_p = (pointer)0x0;
  local_2d0.m_name._M_string_length = 0xff00000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(IVec4 *)&local_2d0);
  iVar6 = 0;
  if (iVar4 < 1) {
    iVar4 = iVar6;
  }
  iVar8 = (config->viewportSize).m_data[1];
  if (iVar5 < iVar8) {
    iVar8 = iVar5;
  }
  if (iVar4 < iVar8) {
    if (iVar13 < 1) {
      iVar13 = iVar6;
    }
    do {
      iVar8 = local_4a8->m_data[0];
      if (iVar12 < local_4a8->m_data[0]) {
        iVar8 = iVar12;
      }
      iVar9 = iVar13;
      if (iVar13 < iVar8) {
        do {
          uVar2 = *(uint *)((long)local_4c0.m_pixels.m_ptr +
                           (long)(local_4c0.m_width * iVar4 + iVar9) * 4);
          if ((((iVar9 < (int)local_408._16_4_) || (iVar4 < local_3f4)) || (local_3f0 < iVar9)) ||
             (local_3ec < iVar4)) {
            if ((uVar2 & 0xffffff) != 0) goto LAB_016786dc;
          }
          else if ((((int)local_408._0_4_ < iVar9) && ((int)local_408._4_4_ < iVar4)) &&
                  ((iVar9 < (int)local_408._8_4_ &&
                   ((iVar4 < (int)local_408._12_4_ && ((uVar2 & 0xffff00) != 0xff00)))))) {
LAB_016786dc:
            *(undefined4 *)
             ((long)local_4a0.m_pixels.m_ptr + (long)(local_4a0.m_width * iVar4 + iVar9) * 4) =
                 0xff0000ff;
            iVar6 = 1;
          }
          iVar9 = iVar9 + 1;
          iVar8 = local_4a8->m_data[0];
          if (iVar12 < local_4a8->m_data[0]) {
            iVar8 = iVar12;
          }
        } while (iVar9 < iVar8);
      }
      iVar4 = iVar4 + 1;
      iVar8 = (config->viewportSize).m_data[1];
      if (iVar5 < iVar8) {
        iVar8 = iVar5;
      }
    } while (iVar4 < iVar8);
    pGVar10 = local_488;
    if (iVar6 != 0) {
      local_1b0._0_8_ = ((local_488->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Image verification failed.",0x1a);
      pTVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Images","");
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Image verification","");
      tcu::LogImageSet::LogImageSet(&local_310,&local_448,&local_468);
      tcu::TestLog::startImageSet
                (pTVar7,local_310.m_name._M_dataplus._M_p,local_310.m_description._M_dataplus._M_p);
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Viewport","");
      local_3e8._M_allocated_capacity = (size_type)&local_3d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Viewport contents","");
      local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
      if ((void *)local_4c0.m_pixels.m_cap != (void *)0x0) {
        local_4c0.m_pixels.m_cap = (size_t)local_4c0.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_390,(TextureFormat *)&local_240,local_4c0.m_width,
                 local_4c0.m_height,1,(void *)local_4c0.m_pixels.m_cap);
      access = (ConstPixelBufferAccess *)local_390;
      tcu::LogImage::LogImage
                (&local_2d0,&local_428,(string *)&local_3e8,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d0,(int)pTVar7,__buf,(size_t)access);
      local_348._0_8_ = (pointer)(local_348 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"ErrorMask","");
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Error mask","");
      local_3c8._8_8_ = 0x300000008;
      if ((void *)local_4a0.m_pixels.m_cap != (void *)0x0) {
        local_4a0.m_pixels.m_cap = (size_t)local_4a0.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_3b8,(TextureFormat *)(local_3c8 + 8),local_4a0.m_width,
                 local_4a0.m_height,1,(void *)local_4a0.m_pixels.m_cap);
      access_00 = &local_3b8;
      tcu::LogImage::LogImage
                (&local_240,(string *)local_348,&local_368,(ConstPixelBufferAccess *)access_00,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,(int)pTVar7,__buf_00,(size_t)access_00);
      tcu::TestLog::endImageSet(pTVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
        operator_delete(local_240.m_description._M_dataplus._M_p,
                        local_240.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
        operator_delete(local_240.m_name._M_dataplus._M_p,
                        local_240.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_348._0_8_ != (pointer)(local_348 + 0x10)) {
        operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
      }
      pGVar10 = local_488;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
        operator_delete(local_2d0.m_description._M_dataplus._M_p,
                        local_2d0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
        operator_delete(local_2d0.m_name._M_dataplus._M_p,
                        local_2d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_allocated_capacity != &local_3d8) {
        operator_delete((void *)local_3e8._M_allocated_capacity,
                        (ulong)(local_3d8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310.m_description._M_dataplus._M_p != &local_310.m_description.field_2) {
        operator_delete(local_310.m_description._M_dataplus._M_p,
                        local_310.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310.m_name._M_dataplus._M_p != &local_310.m_name.field_2) {
        operator_delete(local_310.m_name._M_dataplus._M_p,
                        local_310.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      tcu::TestContext::setTestResult
                ((pGVar10->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Image verification failed");
      goto LAB_01678e05;
    }
  }
  local_1b0._0_8_ = ((pGVar10->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Result image ok.",0x10);
  pTVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_390._0_8_ = (long)local_390 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"Images","");
  local_3b8._M_allocated_capacity = (size_type)&local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"Image verification","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,(string *)local_390,(string *)&local_3b8);
  tcu::TestLog::startImageSet
            (pTVar7,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Viewport","");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Viewport contents","");
  local_428._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_4c0.m_pixels.m_cap != (void *)0x0) {
    local_4c0.m_pixels.m_cap = (size_t)local_4c0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_310,(TextureFormat *)&local_428,local_4c0.m_width,
             local_4c0.m_height,1,(void *)local_4c0.m_pixels.m_cap);
  access_01 = &local_310;
  tcu::LogImage::LogImage
            (&local_2d0,&local_448,&local_468,(ConstPixelBufferAccess *)access_01,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_2d0,(int)pTVar7,__buf_01,(size_t)access_01);
  tcu::TestLog::endImageSet(pTVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
    operator_delete(local_2d0.m_description._M_dataplus._M_p,
                    local_2d0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
    operator_delete(local_2d0.m_name._M_dataplus._M_p,
                    local_2d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
    operator_delete(local_240.m_description._M_dataplus._M_p,
                    local_240.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
    operator_delete(local_240.m_name._M_dataplus._M_p,
                    local_240.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_allocated_capacity != &local_3a8) {
    operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
  }
  if (local_390._0_8_ != (long)local_390 + 0x10) {
    operator_delete((void *)local_390._0_8_,(ulong)(local_390._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
LAB_01678e05:
  tcu::Surface::~Surface(&local_4a0);
  tcu::Surface::~Surface(&local_4c0);
  return;
}

Assistant:

void GridRenderCase::verifyRenderResult (const IterationConfig& config)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const ProjectedBBox		projectedBBox			= projectBoundingBox(config.bbox);
	const tcu::IVec4		viewportBBoxArea		= getViewportBoundingBoxArea(projectedBBox, config.viewportSize);
	const tcu::IVec4		viewportGridOuterArea	= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_OUTWARDS);
	const tcu::IVec4		viewportGridInnerArea	= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_INWARDS);
	tcu::Surface			viewportSurface			(config.viewportSize.x(), config.viewportSize.y());
	tcu::Surface			errorMask				(config.viewportSize.x(), config.viewportSize.y());
	bool					anyError				= false;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Projected bounding box: (clip space)\n"
				<< "\tx: [" << projectedBBox.min.x() << "," << projectedBBox.max.x() << "]\n"
				<< "\ty: [" << projectedBBox.min.y() << "," << projectedBBox.max.y() << "]\n"
				<< "\tz: [" << projectedBBox.min.z() << "," << projectedBBox.max.z() << "]\n"
			<< "In viewport coordinates:\n"
				<< "\tx: [" << viewportBBoxArea.x() << ", " << viewportBBoxArea.z() << "]\n"
				<< "\ty: [" << viewportBBoxArea.y() << ", " << viewportBBoxArea.w() << "]\n"
			<< "Verifying render results within the bounding box.\n"
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying render result."
			<< tcu::TestLog::EndMessage;

	if (m_fbo)
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	glu::readPixels(m_context.getRenderContext(), config.viewportPos.x(), config.viewportPos.y(), viewportSurface.getAccess());

	tcu::clear(errorMask.getAccess(), tcu::IVec4(0,0,0,255));

	for (int y = de::max(viewportBBoxArea.y(), 0); y < de::min(viewportBBoxArea.w(), config.viewportSize.y()); ++y)
	for (int x = de::max(viewportBBoxArea.x(), 0); x < de::min(viewportBBoxArea.z(), config.viewportSize.x()); ++x)
	{
		const tcu::RGBA	pixel		= viewportSurface.getPixel(x, y);
		const bool		outsideGrid	= x < viewportGridOuterArea.x() ||
									  y < viewportGridOuterArea.y() ||
									  x > viewportGridOuterArea.z() ||
									  y > viewportGridOuterArea.w();
		const bool		insideGrid	= x > viewportGridInnerArea.x() &&
									  y > viewportGridInnerArea.y() &&
									  x < viewportGridInnerArea.z() &&
									  y < viewportGridInnerArea.w();

		bool			error		= false;

		if (outsideGrid)
		{
			// expect black
			if (pixel.getRed() != 0 || pixel.getGreen() != 0 || pixel.getBlue() != 0)
				error = true;
		}

		else if (insideGrid)
		{
			// expect green, yellow or a combination of these
			if (pixel.getGreen() != 255 || pixel.getBlue() != 0)
				error = true;
		}
		else
		{
			// boundary, allow anything
		}

		if (error)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			anyError = true;
		}
	}

	if (anyError)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result image ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
}